

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_intra_frame_mode_info(AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r)

{
  PREDICTION_MODE PVar1;
  UV_PREDICTION_MODE UVar2;
  uint8_t uVar3;
  undefined1 uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MACROBLOCKD *xd_00;
  AV1_COMMON *in_RDX;
  uint *in_RSI;
  long in_RDI;
  PREDICTION_MODE intra_mode;
  aom_reader *in_stack_00000028;
  int use_angle_delta;
  int mi_col;
  int mi_row;
  FRAME_CONTEXT *ec_ctx;
  segmentation *seg;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  AV1_COMMON *in_stack_ffffffffffffff80;
  AV1_COMMON *ec_ctx_00;
  AV1_COMMON *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  AV1_COMMON *pAVar8;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AV1_COMMON *pAVar9;
  undefined7 in_stack_ffffffffffffffc0;
  BLOCK_SIZE bsize_00;
  aom_reader *r_00;
  AV1_COMMON *cm_00;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  cm_00 = (AV1_COMMON *)**(undefined8 **)(in_RSI + 0x7ae);
  pAVar8 = *(AV1_COMMON **)(in_RSI + 0x7b4);
  r_00 = *(aom_reader **)(in_RSI + 0x7b2);
  bsize_00 = (cm_00->current_frame).frame_type;
  xd_00 = (MACROBLOCKD *)(in_RDI + 19000);
  ec_ctx_00 = *(AV1_COMMON **)(in_RSI + 0xa66);
  if (*(char *)(in_RDI + 0x4ae0) != '\0') {
    iVar6 = read_intra_segment_id
                      (cm_00,(MACROBLOCKD *)pAVar8,(BLOCK_SIZE)((ulong)r_00 >> 0x38),
                       (aom_reader *)CONCAT17(bsize_00,in_stack_ffffffffffffffc0),
                       (int)((ulong)xd_00 >> 0x20));
    *(ushort *)((long)cm_00->buffer_removal_times + 0x53) =
         *(ushort *)((long)cm_00->buffer_removal_times + 0x53) & 0xfff8 | (byte)iVar6 & 7;
  }
  iVar7 = read_skip_txfm((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                         ,(MACROBLOCKD *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),iVar7,
                         (aom_reader *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                        );
  *(char *)(cm_00->buffer_removal_times + 0xf) = (char)iVar7;
  if ((char)xd_00->plane[0].seg_dequant_QTX[6][0] == '\0') {
    iVar7 = read_intra_segment_id
                      (cm_00,(MACROBLOCKD *)pAVar8,(BLOCK_SIZE)((ulong)r_00 >> 0x38),
                       (aom_reader *)CONCAT17(bsize_00,in_stack_ffffffffffffffc0),
                       (int)((ulong)xd_00 >> 0x20));
    *(ushort *)((long)cm_00->buffer_removal_times + 0x53) =
         *(ushort *)((long)cm_00->buffer_removal_times + 0x53) & 0xfff8 | (byte)iVar7 & 7;
  }
  read_cdef(pAVar8,r_00,(MACROBLOCKD *)CONCAT17(bsize_00,in_stack_ffffffffffffffc0));
  read_delta_q_params((AV1_COMMON *)CONCAT17(bsize_00,in_stack_ffffffffffffffc0),xd_00,
                      (aom_reader *)ec_ctx_00);
  (cm_00->current_frame).order_hint = in_RSI[0xa79];
  *(undefined1 *)&(cm_00->current_frame).frame_number = 0;
  *(undefined1 *)((long)&(cm_00->current_frame).frame_number + 1) = 0xff;
  *(undefined1 *)((long)cm_00->buffer_removal_times + 0x3a) = 0;
  *(undefined1 *)((long)cm_00->buffer_removal_times + 0x3b) = 0;
  *(undefined1 *)((long)cm_00->buffer_removal_times + 7) = 0;
  *(long *)(in_RSI + 0x7f0) =
       *(long *)(*(long *)(in_RDI + 0x6318) + (long)(int)in_RSI[0x7ac] * 8) + (long)(int)in_RSI[1];
  *(long *)(in_RSI + 0x7f2) = (long)in_RSI + (long)(int)(*in_RSI & 0x1f) + 0x1fd0;
  iVar7 = av1_allow_intrabc(in_stack_ffffffffffffff80);
  if (iVar7 != 0) {
    read_intrabc_info((AV1_COMMON *)ec_ctx,_mi_col,in_stack_00000028);
    iVar7 = is_intrabc_block((MB_MODE_INFO *)cm_00);
    if (iVar7 != 0) {
      return;
    }
  }
  pAVar8 = in_RDX;
  get_y_mode_cdf((FRAME_CONTEXT *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (MB_MODE_INFO *)in_stack_ffffffffffffff88,(MB_MODE_INFO *)in_stack_ffffffffffffff80
                );
  PVar1 = read_intra_mode((aom_reader *)in_stack_ffffffffffffff80,
                          (aom_cdf_prob *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  (cm_00->current_frame).field_0x2 = PVar1;
  iVar7 = av1_use_angle_delta(bsize_00);
  if ((iVar7 == 0) ||
     (iVar6 = av1_is_directional_mode((cm_00->current_frame).field_0x2), iVar6 == 0)) {
    iVar6 = 0;
  }
  else {
    iVar6 = read_angle_delta((aom_reader *)in_stack_ffffffffffffff80,
                             (aom_cdf_prob *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  *(char *)(cm_00->buffer_removal_times + 1) = (char)iVar6;
  if ((*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) == '\0') && ((in_RSI[3] & 1) != 0)) {
    pAVar9 = ec_ctx_00;
    is_cfl_allowed((MACROBLOCKD *)pAVar8);
    UVar2 = read_intra_mode_uv((FRAME_CONTEXT *)ec_ctx_00,
                               (aom_reader *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),'\0',
                               '\0');
    (cm_00->current_frame).field_0x3 = UVar2;
    in_stack_ffffffffffffff80 = ec_ctx_00;
    in_stack_ffffffffffffff88 = in_RDX;
    if ((cm_00->current_frame).field_0x3 == '\r') {
      uVar3 = read_cfl_alphas((FRAME_CONTEXT *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),
                              (aom_reader *)pAVar8,
                              (int8_t *)CONCAT44(iVar6,in_stack_ffffffffffffff90));
      *(uint8_t *)((long)cm_00->buffer_removal_times + 9) = uVar3;
      in_stack_ffffffffffffff80 = ec_ctx_00;
      in_stack_ffffffffffffff88 = in_RDX;
    }
    ec_ctx_00 = pAVar9;
    PVar1 = get_uv_mode((cm_00->current_frame).field_0x3);
    if ((iVar7 == 0) || (iVar7 = av1_is_directional_mode(PVar1), iVar7 == 0)) {
      uVar4 = 0;
    }
    else {
      iVar7 = read_angle_delta((aom_reader *)in_stack_ffffffffffffff80,
                               (aom_cdf_prob *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      uVar4 = (undefined1)iVar7;
    }
    *(undefined1 *)((long)cm_00->buffer_removal_times + 5) = uVar4;
  }
  else {
    (cm_00->current_frame).field_0x3 = 0;
  }
  bVar5 = store_cfl_required(in_stack_ffffffffffffff88,(MACROBLOCKD *)in_stack_ffffffffffffff80);
  in_RSI[0xeac] = (uint)bVar5;
  iVar7 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x1ef) & 1),bsize_00);
  if (iVar7 != 0) {
    read_palette_mode_info
              ((AV1_COMMON *)CONCAT17(bsize_00,in_stack_ffffffffffffffc0),xd_00,
               (aom_reader *)ec_ctx_00);
  }
  read_filter_intra_mode_info
            ((AV1_COMMON *)CONCAT44(iVar6,in_stack_ffffffffffffff90),
             (MACROBLOCKD *)in_stack_ffffffffffffff88,(aom_reader *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

static void read_intra_frame_mode_info(AV1_COMMON *const cm,
                                       DecoderCodingBlock *dcb, aom_reader *r) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const BLOCK_SIZE bsize = mbmi->bsize;
  struct segmentation *const seg = &cm->seg;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  if (seg->segid_preskip)
    mbmi->segment_id = read_intra_segment_id(cm, xd, bsize, r, 0);

  mbmi->skip_txfm = read_skip_txfm(cm, xd, mbmi->segment_id, r);

  if (!seg->segid_preskip)
    mbmi->segment_id = read_intra_segment_id(cm, xd, bsize, r, mbmi->skip_txfm);

  read_cdef(cm, r, xd);

  read_delta_q_params(cm, xd, r);

  mbmi->current_qindex = xd->current_base_qindex;

  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  xd->above_txfm_context = cm->above_contexts.txfm[xd->tile.tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  if (av1_allow_intrabc(cm)) {
    read_intrabc_info(cm, dcb, r);
    if (is_intrabc_block(mbmi)) return;
  }

  mbmi->mode = read_intra_mode(r, get_y_mode_cdf(ec_ctx, above_mi, left_mi));

  const int use_angle_delta = av1_use_angle_delta(bsize);
  mbmi->angle_delta[PLANE_TYPE_Y] =
      (use_angle_delta && av1_is_directional_mode(mbmi->mode))
          ? read_angle_delta(r, ec_ctx->angle_delta_cdf[mbmi->mode - V_PRED])
          : 0;

  if (!cm->seq_params->monochrome && xd->is_chroma_ref) {
    mbmi->uv_mode =
        read_intra_mode_uv(ec_ctx, r, is_cfl_allowed(xd), mbmi->mode);
    if (mbmi->uv_mode == UV_CFL_PRED) {
      mbmi->cfl_alpha_idx = read_cfl_alphas(ec_ctx, r, &mbmi->cfl_alpha_signs);
    }
    const PREDICTION_MODE intra_mode = get_uv_mode(mbmi->uv_mode);
    mbmi->angle_delta[PLANE_TYPE_UV] =
        (use_angle_delta && av1_is_directional_mode(intra_mode))
            ? read_angle_delta(r, ec_ctx->angle_delta_cdf[intra_mode - V_PRED])
            : 0;
  } else {
    // Avoid decoding angle_info if there is no chroma prediction
    mbmi->uv_mode = UV_DC_PRED;
  }
  xd->cfl.store_y = store_cfl_required(cm, xd);

  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize))
    read_palette_mode_info(cm, xd, r);

  read_filter_intra_mode_info(cm, xd, r);
}